

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<unsigned_int> * __thiscall
wasm::WATParser::fieldidx<wasm::WATParser::ParseDefsCtx>
          (Result<unsigned_int> *__return_storage_ptr__,WATParser *this,ParseDefsCtx *ctx,
          HeapTypeT type)

{
  optional<unsigned_int> oVar1;
  bool bVar2;
  uint *puVar3;
  Name *pNVar4;
  Lexer *this_00;
  allocator<char> local_a9;
  string local_a8;
  Err local_88;
  size_t local_68;
  char *local_60;
  HeapType local_58;
  undefined1 local_50 [8];
  optional<wasm::Name> id;
  _Optional_payload_base<unsigned_int> local_30;
  optional<unsigned_int> x;
  ParseDefsCtx *ctx_local;
  HeapTypeT type_local;
  
  type_local.type.id._0_4_ = (undefined4)type.type.id;
  x.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)(_Optional_base<unsigned_int,_true,_true>)this;
  ctx_local = ctx;
  type_local._8_8_ = __return_storage_ptr__;
  local_30 = (_Optional_payload_base<unsigned_int>)Lexer::takeU32((Lexer *)(this + 8));
  bVar2 = std::optional::operator_cast_to_bool((optional *)&local_30);
  oVar1 = x;
  if (bVar2) {
    id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Name>._16_8_ =
         TypeParserCtx::HeapTypeT::operator_cast_to_HeapType((HeapTypeT *)&ctx_local);
    puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_30);
    ParseDefsCtx::getFieldFromIdx
              (__return_storage_ptr__,
               (ParseDefsCtx *)
               oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>,
               (HeapType)
               id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_,*puVar3);
  }
  else {
    Lexer::takeID((optional<wasm::Name> *)local_50,
                  (Lexer *)((long)x.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                  super__Optional_payload_base<unsigned_int> + 8));
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_50);
    oVar1 = x;
    if (bVar2) {
      local_58 = TypeParserCtx::HeapTypeT::operator_cast_to_HeapType((HeapTypeT *)&ctx_local);
      pNVar4 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_50);
      local_68 = (pNVar4->super_IString).str._M_len;
      local_60 = (pNVar4->super_IString).str._M_str;
      ParseDefsCtx::getFieldFromName
                (__return_storage_ptr__,
                 (ParseDefsCtx *)
                 oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>,local_58,
                 (Name)(pNVar4->super_IString).str);
    }
    else {
      this_00 = (Lexer *)((long)x.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                super__Optional_payload_base<unsigned_int> + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"expected field index or identifier",&local_a9);
      Lexer::err(&local_88,this_00,&local_a8);
      Result<unsigned_int>::Result(__return_storage_ptr__,&local_88);
      wasm::Err::~Err(&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::FieldIdxT> fieldidx(Ctx& ctx,
                                         typename Ctx::HeapTypeT type) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getFieldFromIdx(type, *x);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getFieldFromName(type, *id);
  }
  return ctx.in.err("expected field index or identifier");
}